

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_walldraw.cpp
# Opt level: O1

void swrenderer::ProcessWallNP2
               (int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,double yrepeat,
               double top,double bot,bool mask)

{
  short sVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  short sVar5;
  short *psVar6;
  short *psVar7;
  double __y;
  double dVar8;
  double dVar9;
  short most3 [5760];
  short most1 [5760];
  short most2 [5760];
  short local_8738 [5760];
  short local_5a38 [5760];
  short local_2d38 [5764];
  
  dVar2 = ViewPos.Z;
  dVar9 = (double)*(ushort *)(rw_pic + 0x3a);
  __y = dVar9 * (1.0 / yrepeat);
  dVar8 = (1.0 / yrepeat) * dc_texturemid + ViewPos.Z;
  if (0.0 <= yrepeat) {
    dVar8 = fmod(top - dVar8,__y);
    dVar8 = (top - dVar8) - (double)(-(ulong)(top == top - dVar8) & (ulong)__y);
    dc_texturemid = (dVar8 - dVar2) * yrepeat + dVar9;
    if (bot < dVar8) {
      psVar6 = local_5a38;
      do {
        iVar3 = R_CreateWallSegmentY
                          (local_8738,dVar8 - ViewPos.Z,dVar8 - ViewPos.Z,(FWallCoords *)&WallC);
        psVar7 = psVar6;
        if (iVar3 != 3) {
          lVar4 = (long)x1;
          if (x1 < x2) {
            do {
              sVar1 = local_8738[lVar4];
              sVar5 = dwal[lVar4];
              if (sVar1 < dwal[lVar4]) {
                sVar5 = sVar1;
              }
              if (sVar1 <= uwal[lVar4]) {
                sVar5 = uwal[lVar4];
              }
              psVar6[lVar4] = sVar5;
              lVar4 = lVar4 + 1;
            } while (x2 != lVar4);
          }
          ProcessWall(x1,x2,uwal,psVar6,swal,lwal,yrepeat,mask);
          uwal = psVar6;
          psVar7 = local_5a38;
          if (psVar6 == local_5a38) {
            psVar7 = local_2d38;
          }
        }
        dVar8 = dVar8 - __y;
        dc_texturemid = dc_texturemid - dVar9;
        psVar6 = psVar7;
      } while (bot < dVar8);
    }
  }
  else {
    dVar8 = fmod(bot - dVar8,__y);
    dVar8 = bot - dVar8;
    dc_texturemid = (dVar8 - dVar2) * yrepeat + dVar9;
    if (dVar8 < top) {
      psVar6 = local_5a38;
      do {
        iVar3 = R_CreateWallSegmentY
                          (local_8738,dVar8 - ViewPos.Z,dVar8 - ViewPos.Z,(FWallCoords *)&WallC);
        psVar7 = psVar6;
        if (iVar3 != 0xc) {
          lVar4 = (long)x1;
          if (x1 < x2) {
            do {
              sVar1 = local_8738[lVar4];
              sVar5 = dwal[lVar4];
              if (sVar1 < dwal[lVar4]) {
                sVar5 = sVar1;
              }
              if (sVar1 <= uwal[lVar4]) {
                sVar5 = uwal[lVar4];
              }
              psVar6[lVar4] = sVar5;
              lVar4 = lVar4 + 1;
            } while (x2 != lVar4);
          }
          ProcessWall(x1,x2,psVar6,dwal,swal,lwal,yrepeat,mask);
          dwal = psVar6;
          psVar7 = local_5a38;
          if (psVar6 == local_5a38) {
            psVar7 = local_2d38;
          }
        }
        dVar8 = dVar8 - __y;
        dc_texturemid = dc_texturemid - dVar9;
        psVar6 = psVar7;
      } while (dVar8 < top);
    }
  }
  ProcessWall(x1,x2,uwal,dwal,swal,lwal,yrepeat,mask);
  return;
}

Assistant:

static void ProcessWallNP2(int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal, double yrepeat, double top, double bot, bool mask)
{
	short most1[MAXWIDTH], most2[MAXWIDTH], most3[MAXWIDTH];
	short *up, *down;
	double texheight = rw_pic->GetHeight();
	double partition;
	double scaledtexheight = texheight / yrepeat;

	if (yrepeat >= 0)
	{ // normal orientation: draw strips from top to bottom
		partition = top - fmod(top - dc_texturemid / yrepeat - ViewPos.Z, scaledtexheight);
		if (partition == top)
		{
			partition -= scaledtexheight;
		}
		up = uwal;
		down = most1;
		dc_texturemid = (partition - ViewPos.Z) * yrepeat + texheight;
		while (partition > bot)
		{
			int j = R_CreateWallSegmentY(most3, partition - ViewPos.Z, &WallC);
			if (j != 3)
			{
				for (int j = x1; j < x2; ++j)
				{
					down[j] = clamp(most3[j], up[j], dwal[j]);
				}
				ProcessWall(x1, x2, up, down, swal, lwal, yrepeat, mask);
				up = down;
				down = (down == most1) ? most2 : most1;
			}
			partition -= scaledtexheight;
			dc_texturemid -= texheight;
 		}
		ProcessWall(x1, x2, up, dwal, swal, lwal, yrepeat, mask);
	}
	else
	{ // upside down: draw strips from bottom to top
		partition = bot - fmod(bot - dc_texturemid / yrepeat - ViewPos.Z, scaledtexheight);
		up = most1;
		down = dwal;
		dc_texturemid = (partition - ViewPos.Z) * yrepeat + texheight;
		while (partition < top)
		{
			int j = R_CreateWallSegmentY(most3, partition - ViewPos.Z, &WallC);
			if (j != 12)
			{
				for (int j = x1; j < x2; ++j)
				{
					up[j] = clamp(most3[j], uwal[j], down[j]);
				}
				ProcessWall(x1, x2, up, down, swal, lwal, yrepeat, mask);
				down = up;
				up = (up == most1) ? most2 : most1;
			}
			partition -= scaledtexheight;
			dc_texturemid -= texheight;
 		}
		ProcessWall(x1, x2, uwal, down, swal, lwal, yrepeat, mask);
	}
}